

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void Intra4Preds_SSE2(uint8_t *dst,uint8_t *top)

{
  ulong uVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  ushort uVar12;
  unkuint9 Var13;
  uint8_t *puVar14;
  uint8_t uVar15;
  long lVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  short sVar19;
  int iVar20;
  short sVar27;
  short sVar29;
  undefined1 auVar21 [16];
  short sVar26;
  undefined1 uVar28;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 uVar30;
  undefined4 uVar31;
  undefined1 uVar39;
  undefined1 uVar40;
  undefined1 auVar34 [16];
  undefined1 uVar41;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 uVar43;
  undefined1 uVar47;
  undefined1 uVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined5 uVar32;
  undefined6 uVar33;
  undefined1 uVar42;
  undefined1 auVar46 [16];
  undefined1 uVar52;
  undefined1 uVar53;
  undefined1 uVar54;
  
  uVar17 = 4;
  lVar16 = -5;
  while (lVar16 + 1 != 0) {
    uVar17 = uVar17 + top[lVar16 + 5] + (uint)top[lVar16];
    lVar16 = lVar16 + 1;
  }
  Fill_SSE2(dst + 0x600,uVar17 >> 3,4);
  puVar14 = dst + 0x604;
  uVar31 = *(undefined4 *)top;
  for (lVar16 = -2; lVar16 != -6; lVar16 = lVar16 + -1) {
    auVar21 = pshuflw(ZEXT416((uint)top[lVar16] - (uint)top[-1]),
                      ZEXT416((uint)top[lVar16] - (uint)top[-1]),0);
    sVar19 = auVar21._0_2_ + (ushort)(byte)uVar31;
    sVar26 = auVar21._2_2_ + (ushort)(byte)((uint)uVar31 >> 8);
    sVar27 = auVar21._4_2_ + (ushort)(byte)((uint)uVar31 >> 0x10);
    sVar29 = auVar21._6_2_ + (ushort)(byte)((uint)uVar31 >> 0x18);
    *(uint *)puVar14 =
         CONCAT13((0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29),
                  CONCAT12((0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27),
                           CONCAT11((0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26)
                                    ,(0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 -
                                     (0xff < sVar19))));
    puVar14 = puVar14 + 0x20;
  }
  uVar1 = *(ulong *)(top + -1);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar1;
  auVar36._8_4_ = (int)uVar1;
  auVar36._0_8_ = uVar1;
  auVar36._12_4_ = (int)(uVar1 >> 0x20);
  uVar39 = (undefined1)(uVar1 >> 0x10);
  auVar34[0] = pavgb((char)uVar1,uVar39);
  uVar40 = (undefined1)(uVar1 >> 0x18);
  uVar30 = (undefined1)(uVar1 >> 8);
  auVar34[1] = pavgb(uVar30,uVar40);
  uVar41 = (undefined1)(uVar1 >> 0x20);
  auVar34[2] = pavgb(uVar39,uVar41);
  uVar42 = (undefined1)(uVar1 >> 0x28);
  auVar34[3] = pavgb(uVar40,uVar42);
  uVar47 = (undefined1)(uVar1 >> 0x30);
  auVar34[4] = pavgb(uVar41,uVar47);
  uVar28 = (undefined1)(uVar1 >> 0x38);
  auVar34[5] = pavgb(uVar42,uVar28);
  auVar34[6] = pavgb(uVar47,0);
  auVar34[7] = pavgb(uVar28,0);
  auVar34[8] = pavgb(0,0);
  auVar34[9] = pavgb(0,0);
  auVar34[10] = pavgb(0,0);
  auVar34[0xb] = pavgb(0,0);
  auVar34[0xc] = pavgb(0,0);
  auVar34[0xd] = pavgb(0,0);
  auVar34[0xe] = pavgb(0,0);
  auVar34[0xf] = pavgb(0,0);
  auVar21 = psubusb(auVar34,(auVar36 >> 0x50 ^ auVar21) & _DAT_0013a1c0);
  uVar30 = pavgb(auVar21[0],uVar30);
  uVar39 = pavgb(auVar21[1],uVar39);
  uVar40 = pavgb(auVar21[2],uVar40);
  uVar41 = pavgb(auVar21[3],uVar41);
  pavgb(auVar21[4],uVar42);
  pavgb(auVar21[5],uVar47);
  pavgb(auVar21[6],uVar28);
  pavgb(auVar21[7],0);
  pavgb(auVar21[8],0);
  pavgb(auVar21[9],0);
  pavgb(auVar21[10],0);
  pavgb(auVar21[0xb],0);
  pavgb(auVar21[0xc],0);
  pavgb(auVar21[0xd],0);
  pavgb(auVar21[0xe],0);
  pavgb(auVar21[0xf],0);
  for (lVar16 = 0; lVar16 != 0x80; lVar16 = lVar16 + 0x20) {
    *(uint *)(dst + lVar16 + 0x608) = CONCAT13(uVar41,CONCAT12(uVar40,CONCAT11(uVar39,uVar30)));
  }
  bVar3 = top[-2];
  bVar4 = top[-3];
  bVar5 = top[-4];
  bVar6 = top[-5];
  *(uint *)(dst + 0x60c) = ((uint)top[-1] + (uint)bVar3 * 2 + (uint)bVar4 + 2 >> 2) * 0x1010101;
  *(uint *)(dst + 0x62c) = ((uint)bVar3 + (uint)bVar4 * 2 + (uint)bVar5 + 2 >> 2) * 0x1010101;
  *(uint *)(dst + 0x64c) = ((uint)bVar4 + (uint)bVar5 * 2 + 2 + (uint)bVar6 >> 2) * 0x1010101;
  *(uint *)(dst + 0x66c) = ((uint)bVar5 + (uint)bVar6 + 2 + (uint)bVar6 * 2 >> 2) * 0x1010101;
  auVar21 = _DAT_0013a1c0;
  uVar2 = (undefined8)*(unkuint9 *)(top + -5);
  uVar15 = top[3];
  Var13 = *(unkuint9 *)(top + -5);
  uVar40 = (undefined1)((ulong)uVar2 >> 0x10);
  auVar35[0] = pavgb(uVar40,(char)uVar2);
  uVar39 = (undefined1)((ulong)uVar2 >> 8);
  uVar41 = (undefined1)((ulong)uVar2 >> 0x18);
  auVar35[1] = pavgb(uVar41,uVar39);
  uVar42 = (undefined1)((ulong)uVar2 >> 0x20);
  auVar35[2] = pavgb(uVar42,uVar40);
  uVar47 = (undefined1)((ulong)uVar2 >> 0x28);
  auVar35[3] = pavgb(uVar47,uVar41);
  uVar28 = (undefined1)((ulong)uVar2 >> 0x30);
  auVar35[4] = pavgb(uVar28,uVar42);
  uVar30 = (undefined1)((ulong)uVar2 >> 0x38);
  auVar35[5] = pavgb(uVar30,uVar47);
  auVar35[6] = pavgb(uVar15,uVar28);
  auVar35[7] = pavgb(0,uVar30);
  auVar35[8] = pavgb(0,uVar15);
  auVar35[9] = pavgb(0,0);
  auVar35[10] = pavgb(0,0);
  auVar35[0xb] = pavgb(0,0);
  auVar35[0xc] = pavgb(0,0);
  auVar35[0xd] = pavgb(0,0);
  auVar35[0xe] = pavgb(0,0);
  auVar35[0xf] = pavgb(0,0);
  auVar22._9_7_ = 0;
  auVar22._0_9_ = Var13 >> 0x10 ^ Var13;
  auVar36 = psubusb(auVar35,auVar22 & _DAT_0013a1c0);
  uVar39 = pavgb(auVar36[0],uVar39);
  uVar40 = pavgb(auVar36[1],uVar40);
  uVar41 = pavgb(auVar36[2],uVar41);
  uVar42 = pavgb(auVar36[3],uVar42);
  uVar31 = CONCAT13(uVar42,CONCAT12(uVar41,CONCAT11(uVar40,uVar39)));
  uVar39 = pavgb(auVar36[4],uVar47);
  uVar32 = CONCAT14(uVar39,uVar31);
  uVar39 = pavgb(auVar36[5],uVar28);
  uVar33 = CONCAT15(uVar39,uVar32);
  uVar39 = pavgb(auVar36[6],uVar30);
  pavgb(auVar36[7],uVar15);
  pavgb(auVar36[8],0);
  pavgb(auVar36[9],0);
  pavgb(auVar36[10],0);
  pavgb(auVar36[0xb],0);
  pavgb(auVar36[0xc],0);
  pavgb(auVar36[0xd],0);
  pavgb(auVar36[0xe],0);
  pavgb(auVar36[0xf],0);
  *(undefined4 *)(dst + 0x670) = uVar31;
  *(int *)(dst + 0x650) = (int)((uint5)uVar32 >> 8);
  *(int *)(dst + 0x630) = (int)((uint6)uVar33 >> 0x10);
  *(int *)(dst + 0x610) = (int)(CONCAT16(uVar39,uVar33) >> 0x18);
  bVar3 = (byte)*(ushort *)(top + -2);
  bVar4 = top[-3];
  bVar5 = top[-4];
  bVar6 = top[-1];
  uVar12 = *(ushort *)(top + -2);
  uVar1 = *(ulong *)(top + -1);
  uVar11 = uVar1 & 0xffffffffffff00;
  auVar44._8_8_ = uVar1 >> 0x38;
  auVar44._0_8_ = uVar11 << 8 | (ulong)uVar12;
  auVar37._0_8_ = uVar1 >> 8;
  auVar37._8_8_ = 0;
  uVar40 = (undefined1)(uVar1 >> 8);
  auVar50[0] = pavgb((char)uVar12,uVar40);
  uVar41 = (undefined1)(uVar1 >> 0x10);
  auVar50[1] = pavgb((char)(uVar12 >> 8),uVar41);
  uVar42 = (undefined1)(uVar1 >> 0x18);
  auVar50[2] = pavgb((char)(uVar11 >> 8),uVar42);
  uVar47 = (undefined1)(uVar1 >> 0x20);
  auVar50[3] = pavgb((char)(uVar11 >> 0x10),uVar47);
  uVar28 = (undefined1)(uVar1 >> 0x28);
  auVar50[4] = pavgb((char)(uVar11 >> 0x18),uVar28);
  uVar30 = (undefined1)(uVar1 >> 0x30);
  auVar50[5] = pavgb((char)(uVar11 >> 0x20),uVar30);
  uVar43 = (undefined1)(uVar1 >> 0x38);
  auVar50[6] = pavgb((char)(uVar11 >> 0x28),uVar43);
  auVar50[7] = pavgb((char)(uVar11 >> 0x30),0);
  auVar50[8] = pavgb(uVar43,0);
  auVar50[9] = pavgb(0,0);
  auVar50[10] = pavgb(0,0);
  auVar50[0xb] = pavgb(0,0);
  auVar50[0xc] = pavgb(0,0);
  auVar50[0xd] = pavgb(0,0);
  auVar50[0xe] = pavgb(0,0);
  auVar50[0xf] = pavgb(0,0);
  auVar36 = psubusb(auVar50,(auVar44 ^ auVar37) & auVar21);
  uVar39 = pavgb(auVar36[0],(char)uVar1);
  uVar52 = pavgb(auVar36[1],uVar40);
  uVar53 = pavgb(auVar36[2],uVar41);
  uVar54 = pavgb(auVar36[3],uVar42);
  iVar49 = CONCAT13(uVar54,CONCAT12(uVar53,CONCAT11(uVar52,uVar39)));
  pavgb(auVar36[4],uVar47);
  pavgb(auVar36[5],uVar28);
  pavgb(auVar36[6],uVar30);
  pavgb(auVar36[7],uVar43);
  pavgb(auVar36[8],0);
  pavgb(auVar36[9],0);
  pavgb(auVar36[10],0);
  pavgb(auVar36[0xb],0);
  pavgb(auVar36[0xc],0);
  pavgb(auVar36[0xd],0);
  pavgb(auVar36[0xe],0);
  pavgb(auVar36[0xf],0);
  uVar39 = pavgb((char)uVar1,uVar40);
  uVar40 = pavgb(uVar40,uVar41);
  uVar41 = pavgb(uVar41,uVar42);
  uVar42 = pavgb(uVar42,uVar47);
  iVar20 = CONCAT13(uVar42,CONCAT12(uVar41,CONCAT11(uVar40,uVar39)));
  pavgb(uVar47,uVar28);
  pavgb(uVar28,uVar30);
  pavgb(uVar30,uVar43);
  pavgb(uVar43,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  *(int *)(dst + 0x614) = iVar20;
  *(int *)(dst + 0x634) = iVar49;
  *(int *)(dst + 0x654) = iVar20 << 8;
  *(int *)(dst + 0x674) = iVar49 << 8;
  dst[0x654] = (uint8_t)((uint)bVar4 + (uint)bVar3 * 2 + (uint)bVar6 + 2 >> 2);
  dst[0x674] = (uint8_t)((uint)bVar5 + (uint)bVar3 + (uint)bVar4 * 2 + 2 >> 2);
  uVar11 = *(ulong *)top;
  auVar23._8_4_ = (int)uVar11;
  auVar23._0_8_ = uVar11;
  auVar23._12_4_ = (int)(uVar11 >> 0x20);
  uVar1 = *(ulong *)top;
  auVar45[0] = pavgb((char)uVar1,(char)(uVar11 >> 0x10));
  uVar41 = (undefined1)(uVar1 >> 8);
  auVar45[1] = pavgb(uVar41,(char)(uVar11 >> 0x18));
  uVar42 = (undefined1)(uVar1 >> 0x10);
  auVar45[2] = pavgb(uVar42,(char)(uVar11 >> 0x20));
  uVar47 = (undefined1)(uVar1 >> 0x18);
  auVar45[3] = pavgb(uVar47,(char)(uVar11 >> 0x28));
  uVar28 = (undefined1)(uVar1 >> 0x20);
  auVar45[4] = pavgb(uVar28,(char)(uVar11 >> 0x30));
  uVar40 = (undefined1)(uVar11 >> 0x38);
  uVar30 = (undefined1)(uVar1 >> 0x28);
  auVar45[5] = pavgb(uVar30,uVar40);
  uVar43 = (undefined1)(uVar1 >> 0x30);
  uVar39 = (undefined1)(uVar1 >> 0x38);
  auVar45[6] = pavgb(uVar43,uVar40);
  auVar45[7] = pavgb(uVar39,0);
  auVar45[8] = pavgb(0,0);
  auVar45[9] = pavgb(0,0);
  auVar45[10] = pavgb(0,0);
  auVar45[0xb] = pavgb(0,0);
  auVar45[0xc] = pavgb(0,0);
  auVar45[0xd] = pavgb(0,0);
  auVar45[0xe] = pavgb(0,0);
  auVar45[0xf] = pavgb(0,0);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = (auVar23._8_8_ >> 0x10 | (uVar11 >> 0x38) << 0x30) ^ uVar1;
  auVar21 = psubusb(auVar45,auVar24 & auVar21);
  uVar40 = pavgb(auVar21[0],uVar41);
  uVar41 = pavgb(auVar21[1],uVar42);
  uVar42 = pavgb(auVar21[2],uVar47);
  uVar47 = pavgb(auVar21[3],uVar28);
  uVar31 = CONCAT13(uVar47,CONCAT12(uVar42,CONCAT11(uVar41,uVar40)));
  uVar40 = pavgb(auVar21[4],uVar30);
  uVar32 = CONCAT14(uVar40,uVar31);
  uVar40 = pavgb(auVar21[5],uVar43);
  uVar33 = CONCAT15(uVar40,uVar32);
  uVar39 = pavgb(auVar21[6],uVar39);
  pavgb(auVar21[7],0);
  pavgb(auVar21[8],0);
  pavgb(auVar21[9],0);
  pavgb(auVar21[10],0);
  pavgb(auVar21[0xb],0);
  pavgb(auVar21[0xc],0);
  pavgb(auVar21[0xd],0);
  pavgb(auVar21[0xe],0);
  pavgb(auVar21[0xf],0);
  *(undefined4 *)(dst + 0x618) = uVar31;
  *(int *)(dst + 0x638) = (int)((uint5)uVar32 >> 8);
  *(int *)(dst + 0x658) = (int)((uint6)uVar33 >> 0x10);
  *(int *)(dst + 0x678) = (int)(CONCAT16(uVar39,uVar33) >> 0x18);
  uVar1 = *(ulong *)top;
  auVar25._0_8_ = uVar1 >> 8;
  auVar25._8_8_ = 0;
  auVar38._8_4_ = (int)uVar1;
  auVar38._0_8_ = uVar1;
  auVar38._12_4_ = (int)(uVar1 >> 0x20);
  uVar39 = (undefined1)(uVar1 >> 8);
  uVar43 = pavgb((char)uVar1,uVar39);
  uVar40 = (undefined1)(uVar1 >> 0x10);
  uVar52 = pavgb(uVar39,uVar40);
  uVar41 = (undefined1)(uVar1 >> 0x18);
  uVar53 = pavgb(uVar40,uVar41);
  uVar42 = (undefined1)(uVar1 >> 0x20);
  uVar54 = pavgb(uVar41,uVar42);
  uVar31 = CONCAT13(uVar54,CONCAT12(uVar53,CONCAT11(uVar52,uVar43)));
  uVar47 = (undefined1)(uVar1 >> 0x28);
  uVar48 = pavgb(uVar42,uVar47);
  auVar46._0_5_ = CONCAT14(uVar48,uVar31);
  uVar28 = (undefined1)(uVar1 >> 0x30);
  auVar46[5] = pavgb(uVar47,uVar28);
  uVar30 = (undefined1)(uVar1 >> 0x38);
  auVar46[6] = pavgb(uVar28,uVar30);
  auVar46[7] = pavgb(uVar30,0);
  auVar46[8] = pavgb(0,0);
  auVar46[9] = pavgb(0,0);
  auVar46[10] = pavgb(0,0);
  auVar46[0xb] = pavgb(0,0);
  auVar46[0xc] = pavgb(0,0);
  auVar46[0xd] = pavgb(0,0);
  auVar46[0xe] = pavgb(0,0);
  auVar46[0xf] = pavgb(0,0);
  auVar51[0] = pavgb(uVar40,uVar39);
  auVar51[1] = pavgb(uVar41,uVar40);
  auVar51[2] = pavgb(uVar42,uVar41);
  auVar51[3] = pavgb(uVar47,uVar42);
  auVar51[4] = pavgb(uVar28,uVar47);
  auVar51[5] = pavgb(uVar30,uVar28);
  auVar51[6] = pavgb(0,uVar30);
  auVar51[7] = pavgb(0,0);
  auVar51[8] = pavgb(0,0);
  auVar51[9] = pavgb(0,0);
  auVar51[10] = pavgb(0,0);
  auVar51[0xb] = pavgb(0,0);
  auVar51[0xc] = pavgb(0,0);
  auVar51[0xd] = pavgb(0,0);
  auVar51[0xe] = pavgb(0,0);
  auVar51[0xf] = pavgb(0,0);
  auVar55[0] = pavgb(uVar43,auVar51[0]);
  auVar55[1] = pavgb(uVar52,auVar51[1]);
  auVar55[2] = pavgb(uVar53,auVar51[2]);
  auVar55[3] = pavgb(uVar54,auVar51[3]);
  auVar55[4] = pavgb(uVar48,auVar51[4]);
  auVar55[5] = pavgb(auVar46[5],auVar51[5]);
  auVar55[6] = pavgb(auVar46[6],auVar51[6]);
  auVar55[7] = pavgb(auVar46[7],auVar51[7]);
  auVar55[8] = pavgb(auVar46[8],auVar51[8]);
  auVar55[9] = pavgb(auVar46[9],auVar51[9]);
  auVar55[10] = pavgb(auVar46[10],auVar51[10]);
  auVar55[0xb] = pavgb(auVar46[0xb],auVar51[0xb]);
  auVar55[0xc] = pavgb(auVar46[0xc],auVar51[0xc]);
  auVar55[0xd] = pavgb(auVar46[0xd],auVar51[0xd]);
  auVar55[0xe] = pavgb(auVar46[0xe],auVar51[0xe]);
  auVar55[0xf] = pavgb(auVar46[0xf],auVar51[0xf]);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar1 ^ auVar25._0_8_;
  auVar21 = psubusb(auVar55,(auVar38 >> 0x50 ^ auVar25 | auVar18) & (auVar51 ^ auVar46) &
                            _DAT_0013a1c0);
  *(undefined4 *)(dst + 0x61c) = uVar31;
  *(int *)(dst + 0x63c) = auVar21._0_4_;
  *(int *)(dst + 0x65c) = (int)((uint5)auVar46._0_5_ >> 8);
  *(int *)(dst + 0x67c) = auVar21._1_4_;
  dst[0x65f] = auVar21[4];
  dst[0x67f] = auVar21[5];
  bVar3 = top[-1];
  bVar4 = top[-2];
  bVar5 = top[-3];
  bVar6 = top[-4];
  bVar7 = top[-5];
  bVar8 = *top;
  bVar9 = top[1];
  bVar10 = top[2];
  uVar15 = (uint8_t)((uint)bVar4 + (uint)bVar3 + 1 >> 1);
  dst[0x6a2] = uVar15;
  dst[0x680] = uVar15;
  uVar15 = (uint8_t)((uint)bVar4 + (uint)bVar5 + 1 >> 1);
  dst[0x6c2] = uVar15;
  dst[0x6a0] = uVar15;
  uVar15 = (uint8_t)((uint)bVar6 + (uint)bVar5 + 1 >> 1);
  dst[0x6e2] = uVar15;
  dst[0x6c0] = uVar15;
  dst[0x6e0] = (uint8_t)((uint)bVar6 + (uint)bVar7 + 1 >> 1);
  dst[0x683] = (uint8_t)((uint)bVar10 + (uint)bVar8 + (uint)bVar9 * 2 + 2 >> 2);
  dst[0x682] = (uint8_t)((uint)bVar3 + (uint)bVar8 * 2 + 2 + (uint)bVar9 >> 2);
  uVar15 = (uint8_t)((uint)bVar4 + (uint)bVar3 * 2 + 2 + (uint)bVar8 >> 2);
  dst[0x6a3] = uVar15;
  dst[0x681] = uVar15;
  uVar15 = (uint8_t)((uint)bVar3 + (uint)bVar5 + 2 + (uint)bVar4 * 2 >> 2);
  dst[0x6c3] = uVar15;
  dst[0x6a1] = uVar15;
  uVar15 = (uint8_t)((uint)bVar4 + (uint)bVar6 + 2 + (uint)bVar5 * 2 >> 2);
  dst[0x6e3] = uVar15;
  dst[0x6c1] = uVar15;
  dst[0x6e1] = (uint8_t)((uint)bVar5 + (uint)bVar7 + (uint)bVar6 * 2 + 2 >> 2);
  bVar3 = top[-2];
  bVar4 = top[-3];
  bVar5 = top[-4];
  bVar6 = top[-5];
  dst[0x684] = (uint8_t)((uint)bVar4 + (uint)bVar3 + 1 >> 1);
  uVar15 = (uint8_t)((uint)bVar4 + (uint)bVar5 + 1 >> 1);
  dst[0x6a4] = uVar15;
  dst[0x686] = uVar15;
  uVar15 = (uint8_t)((uint)bVar5 + (uint)bVar6 + 1 >> 1);
  dst[0x6c4] = uVar15;
  dst[0x6a6] = uVar15;
  dst[0x685] = (uint8_t)((uint)bVar3 + (uint)bVar4 * 2 + (uint)bVar5 + 2 >> 2);
  uVar15 = (uint8_t)((uint)bVar4 + (uint)bVar6 + (uint)bVar5 * 2 + 2 >> 2);
  dst[0x6a5] = uVar15;
  dst[0x687] = uVar15;
  uVar15 = (uint8_t)((uint)bVar5 + (uint)bVar6 + 2 + (uint)bVar6 * 2 >> 2);
  dst[0x6c5] = uVar15;
  dst[0x6a7] = uVar15;
  auVar21 = pshuflw(ZEXT216(CONCAT11(bVar6,bVar6)),ZEXT216(CONCAT11(bVar6,bVar6)),0);
  *(int *)(dst + 0x6e4) = auVar21._0_4_;
  dst[0x6c6] = bVar6;
  dst[0x6c7] = bVar6;
  return;
}

Assistant:

static void Intra4Preds_SSE2(uint8_t* dst, const uint8_t* top) {
  DC4_SSE2(I4DC4 + dst, top);
  TM4_SSE2(I4TM4 + dst, top);
  VE4_SSE2(I4VE4 + dst, top);
  HE4_SSE2(I4HE4 + dst, top);
  RD4_SSE2(I4RD4 + dst, top);
  VR4_SSE2(I4VR4 + dst, top);
  LD4_SSE2(I4LD4 + dst, top);
  VL4_SSE2(I4VL4 + dst, top);
  HD4_SSE2(I4HD4 + dst, top);
  HU4_SSE2(I4HU4 + dst, top);
}